

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void readFileStackNode(FILE *file,FileStackNode *fileNodes,uint32_t i,char *fileName)

{
  int iVar1;
  FileStackNodeType FVar2;
  ulong uVar3;
  int *piVar4;
  int64_t iVar5;
  char *pcVar6;
  uint32_t *puVar7;
  char *local_140;
  char *local_118;
  char *local_100;
  char *local_e8;
  char *local_d0;
  FileStackNode *local_b8;
  char *local_b0;
  int64_t tmpVal_5;
  FILE *tmpFile_5;
  uint32_t k;
  int64_t tmpVal_4;
  FILE *tmpFile_4;
  char *tmpVal_3;
  FILE *tmpFile_3;
  int tmpVal_2;
  FILE *tmpFile_2;
  int64_t tmpVal_1;
  FILE *tmpFile_1;
  int64_t tmpVal;
  FILE *tmpFile;
  uint32_t parentID;
  char *fileName_local;
  uint32_t i_local;
  FileStackNode *fileNodes_local;
  FILE *file_local;
  
  uVar3 = readlong(file);
  if (uVar3 == 0x7fffffffffffffff) {
    iVar1 = feof((FILE *)file);
    if (iVar1 == 0) {
      piVar4 = __errno_location();
      local_b0 = strerror(*piVar4);
    }
    else {
      local_b0 = "Unexpected end of file";
    }
    errx("%s: Cannot read node #%u\'s parent ID: %s",fileName,(ulong)i,local_b0);
  }
  if ((int)uVar3 == -1) {
    local_b8 = (FileStackNode *)0x0;
  }
  else {
    local_b8 = fileNodes + (uVar3 & 0xffffffff);
  }
  fileNodes[i].parent = local_b8;
  iVar5 = readlong(file);
  if (iVar5 == 0x7fffffffffffffff) {
    iVar1 = feof((FILE *)file);
    if (iVar1 == 0) {
      piVar4 = __errno_location();
      local_d0 = strerror(*piVar4);
    }
    else {
      local_d0 = "Unexpected end of file";
    }
    errx("%s: Cannot read node #%u\'s line number: %s",fileName,(ulong)i,local_d0);
  }
  fileNodes[i].lineNo = (uint32_t)iVar5;
  FVar2 = getc((FILE *)file);
  if (FVar2 == ~NODE_REPT) {
    iVar1 = feof((FILE *)file);
    if (iVar1 == 0) {
      piVar4 = __errno_location();
      local_e8 = strerror(*piVar4);
    }
    else {
      local_e8 = "Unexpected end of file";
    }
    errx("%s: Cannot read node #%u\'s type: %s",fileName,(ulong)i,local_e8);
  }
  fileNodes[i].type = FVar2;
  FVar2 = fileNodes[i].type;
  if (FVar2 == NODE_REPT) {
    iVar5 = readlong(file);
    if (iVar5 == 0x7fffffffffffffff) {
      iVar1 = feof((FILE *)file);
      if (iVar1 == 0) {
        piVar4 = __errno_location();
        local_118 = strerror(*piVar4);
      }
      else {
        local_118 = "Unexpected end of file";
      }
      errx("%s: Cannot read node #%u\'s rept depth: %s",fileName,(ulong)i,local_118);
    }
    fileNodes[i].field_3.field_1.reptDepth = (uint32_t)iVar5;
    puVar7 = (uint32_t *)malloc((ulong)fileNodes[i].field_3.field_1.reptDepth << 2);
    fileNodes[i].field_3.field_1.iters = puVar7;
    if (fileNodes[i].field_3.field_1.iters == (uint32_t *)0x0) {
      piVar4 = __errno_location();
      pcVar6 = strerror(*piVar4);
      fatal((FileStackNode *)0x0,0,"%s: Failed to alloc node #%u\'s iters: %s",fileName,(ulong)i,
            pcVar6);
    }
    for (tmpFile_5._4_4_ = 0; tmpFile_5._4_4_ < fileNodes[i].field_3.field_1.reptDepth;
        tmpFile_5._4_4_ = tmpFile_5._4_4_ + 1) {
      iVar5 = readlong(file);
      if (iVar5 == 0x7fffffffffffffff) {
        iVar1 = feof((FILE *)file);
        if (iVar1 == 0) {
          piVar4 = __errno_location();
          local_140 = strerror(*piVar4);
        }
        else {
          local_140 = "Unexpected end of file";
        }
        errx("%s: Cannot read node #%u\'s iter #%u: %s",fileName,(ulong)i,(ulong)tmpFile_5._4_4_,
             local_140);
      }
      fileNodes[i].field_3.field_1.iters[tmpFile_5._4_4_] = (uint32_t)iVar5;
    }
    if (fileNodes[i].parent == (FileStackNode *)0x0) {
      fatal((FileStackNode *)0x0,0,"%s is not a valid object file: root node (#%u) may not be REPT",
            fileName,(ulong)i);
    }
  }
  else if (FVar2 == NODE_FILE || FVar2 == NODE_MACRO) {
    pcVar6 = readstr(file);
    if (pcVar6 == (char *)0x0) {
      iVar1 = feof((FILE *)file);
      if (iVar1 == 0) {
        piVar4 = __errno_location();
        local_100 = strerror(*piVar4);
      }
      else {
        local_100 = "Unexpected end of file";
      }
      errx("%s: Cannot read node #%u\'s file name: %s",fileName,(ulong)i,local_100);
    }
    fileNodes[i].field_3.name = pcVar6;
  }
  return;
}

Assistant:

static void readFileStackNode(FILE *file, struct FileStackNode fileNodes[], uint32_t i,
			      char const *fileName)
{
	uint32_t parentID;

	tryReadlong(parentID, file,
		    "%s: Cannot read node #%" PRIu32 "'s parent ID: %s", fileName, i);
	fileNodes[i].parent = parentID == (uint32_t)-1 ? NULL : &fileNodes[parentID];
	tryReadlong(fileNodes[i].lineNo, file,
		    "%s: Cannot read node #%" PRIu32 "'s line number: %s", fileName, i);
	tryGetc(enum FileStackNodeType, fileNodes[i].type, file,
		"%s: Cannot read node #%" PRIu32 "'s type: %s", fileName, i);
	switch (fileNodes[i].type) {
	case NODE_FILE:
	case NODE_MACRO:
		tryReadstr(fileNodes[i].name, file,
			   "%s: Cannot read node #%" PRIu32 "'s file name: %s", fileName, i);
		break;

	case NODE_REPT:
		tryReadlong(fileNodes[i].reptDepth, file,
			    "%s: Cannot read node #%" PRIu32 "'s rept depth: %s", fileName, i);
		fileNodes[i].iters =
			(uint32_t *)malloc(sizeof(*fileNodes[i].iters) * fileNodes[i].reptDepth);
		if (!fileNodes[i].iters)
			fatal(NULL, 0, "%s: Failed to alloc node #%" PRIu32 "'s iters: %s",
			      fileName, i, strerror(errno));
		for (uint32_t k = 0; k < fileNodes[i].reptDepth; k++)
			tryReadlong(fileNodes[i].iters[k], file,
				    "%s: Cannot read node #%" PRIu32 "'s iter #%" PRIu32 ": %s",
				    fileName, i, k);
		if (!fileNodes[i].parent)
			fatal(NULL, 0, "%s is not a valid object file: root node (#%"
			      PRIu32 ") may not be REPT", fileName, i);
	}
}